

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  BaseType BVar2;
  BaseType BVar3;
  uint32_t uVar4;
  BaseType BVar5;
  BaseType BVar6;
  CompilerError *this_00;
  BaseType BVar7;
  char *pcVar8;
  uint uVar9;
  BaseType BVar10;
  char *pcVar11;
  BaseType BVar12;
  BaseType BVar13;
  uint uVar14;
  BaseType BVar15;
  uint uVar16;
  BaseType BVar17;
  BaseType BVar18;
  BaseType BVar19;
  BaseType BVar20;
  string local_60;
  BaseType local_3c;
  BaseType local_38;
  BaseType local_34;
  
  if ((out_type->pointer == false) && (in_type->pointer != true)) {
    BVar2 = out_type->basetype;
    BVar3 = in_type->basetype;
    if (BVar2 == BVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_007651e3:
      pcVar8 = "";
      pcVar11 = "";
    }
    else {
      if (BVar2 == Boolean) {
        __assert_fail("out_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x25a5,
                      "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      if (BVar3 == Boolean) {
        __assert_fail("in_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x25a6,
                      "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      uVar9 = BVar3 - SByte | BVar2 - SByte;
      if ((uVar9 < 8) && (out_type->width == in_type->width)) goto LAB_007651b8;
      uVar4 = out_type->width;
      BVar5 = in_type->vecsize;
      if ((BVar5 == Void && (0xf < in_type->width && uVar4 == 8)) && uVar9 < 8) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "unpack8";
        pcVar8 = "";
      }
      else {
        uVar14 = in_type->width ^ 8;
        uVar16 = out_type->vecsize ^ 1;
        if (((uVar4 == 0x10 && uVar14 == 0) && uVar16 == 0) && uVar9 < 8) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar11 = "pack16";
          pcVar8 = "";
        }
        else if (((uVar4 == 0x20 && uVar14 == 0) && uVar16 == 0) && uVar9 < 8) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar11 = "pack32";
          pcVar8 = "";
        }
        else {
          BVar10 = BVar2 ^ UInt;
          if (BVar10 == Unknown && (BVar3 ^ Float) == Unknown) {
            bVar1 = (this->options).es;
            uVar9 = (this->options).version;
            if ((uVar9 < 300 & bVar1) == 1) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Float -> Uint bitcast not supported on legacy ESSL.");
LAB_00765950:
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (bVar1 == false && uVar9 < 0x14a) {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
              require_extension_internal(this,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar11 = "floatBitsToUint";
            pcVar8 = "";
          }
          else if ((BVar3 ^ Float) == Unknown && (BVar2 ^ Int) == Unknown) {
            bVar1 = (this->options).es;
            uVar9 = (this->options).version;
            if ((uVar9 < 300 & bVar1) == 1) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Float -> Int bitcast not supported on legacy ESSL.");
              goto LAB_00765950;
            }
            if (bVar1 == false && uVar9 < 0x14a) {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
              require_extension_internal(this,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar11 = "floatBitsToInt";
            pcVar8 = "";
          }
          else {
            BVar13 = BVar3 ^ UInt;
            if ((BVar2 ^ Float) == Unknown && BVar13 == Unknown) {
              bVar1 = (this->options).es;
              uVar9 = (this->options).version;
              if ((uVar9 < 300 & bVar1) == 1) {
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (this_00,"Uint -> Float bitcast not supported on legacy ESSL.");
                goto LAB_00765950;
              }
              if (bVar1 == false && uVar9 < 0x14a) {
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
                require_extension_internal(this,&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p);
                }
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar11 = "uintBitsToFloat";
              pcVar8 = "";
            }
            else if ((BVar2 ^ Float) == Unknown && (BVar3 ^ Int) == Unknown) {
              bVar1 = (this->options).es;
              uVar9 = (this->options).version;
              if ((uVar9 < 300 & bVar1) == 1) {
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (this_00,"Int -> Float bitcast not supported on legacy ESSL.");
                goto LAB_00765950;
              }
              if (bVar1 == false && uVar9 < 0x14a) {
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,"GL_ARB_shader_bit_encoding","");
                require_extension_internal(this,&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p);
                }
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar11 = "intBitsToFloat";
              pcVar8 = "";
            }
            else if ((BVar2 ^ Int64) == Unknown && (BVar3 ^ Double) == Unknown) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar11 = "doubleBitsToInt64";
              pcVar8 = "";
            }
            else {
              BVar15 = BVar2 ^ UInt64;
              if ((BVar3 ^ Double) == Unknown && BVar15 == Unknown) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar11 = "doubleBitsToUint64";
                pcVar8 = "";
              }
              else if ((BVar2 ^ Double) == Unknown && (BVar3 ^ Int64) == Unknown) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar11 = "int64BitsToDouble";
                pcVar8 = "";
              }
              else {
                BVar17 = BVar3 ^ UInt64;
                if ((BVar2 ^ Double) == Unknown && BVar17 == Unknown) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  pcVar11 = "uint64BitsToDouble";
                  pcVar8 = "";
                }
                else {
                  local_38 = BVar2 ^ Short;
                  BVar18 = BVar3 ^ Half;
                  if (local_38 == Unknown && BVar18 == Unknown) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    pcVar11 = "float16BitsToInt16";
                    pcVar8 = "";
                  }
                  else {
                    local_3c = BVar2 ^ UShort;
                    if (local_3c == Unknown && BVar18 == Unknown) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      pcVar11 = "float16BitsToUint16";
                      pcVar8 = "";
                    }
                    else {
                      BVar7 = BVar2 ^ Half;
                      BVar19 = BVar3 ^ Short;
                      if (BVar7 == Unknown && BVar19 == Unknown) {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        pcVar11 = "int16BitsToFloat16";
                        pcVar8 = "";
                      }
                      else {
                        BVar6 = BVar3 ^ UShort;
                        if (BVar7 == Unknown && BVar6 == Unknown) {
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          pcVar11 = "uint16BitsToFloat16";
                          pcVar8 = "";
                        }
                        else {
                          BVar20 = BVar5 ^ Boolean;
                          local_34 = BVar15 | BVar13 | BVar20;
                          if (local_34 == Unknown) {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            pcVar11 = "packUint2x32";
                            pcVar8 = "";
                          }
                          else if (out_type->vecsize == 2 &&
                                   (BVar10 == Unknown && BVar17 == Unknown)) {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            pcVar11 = "unpackUint2x32";
                            pcVar8 = "";
                          }
                          else {
                            BVar12 = BVar5 ^ Void;
                            if ((BVar7 == Unknown && BVar13 == Unknown) && BVar12 == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "unpackFloat2x16";
                              pcVar8 = "";
                            }
                            else if ((BVar18 == Unknown && BVar10 == Unknown) && BVar20 == Unknown)
                            {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "packFloat2x16";
                              pcVar8 = "";
                            }
                            else if (((BVar2 ^ Int) == Unknown && BVar19 == Unknown) &&
                                     BVar20 == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "packInt2x16";
                              pcVar8 = "";
                            }
                            else if (((BVar3 ^ Int) == Unknown && local_38 == Unknown) &&
                                     BVar12 == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "unpackInt2x16";
                              pcVar8 = "";
                            }
                            else if ((BVar10 == Unknown && BVar6 == Unknown) && BVar20 == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "packUint2x16";
                              pcVar8 = "";
                            }
                            else if ((BVar13 == Unknown && local_3c == Unknown) && BVar12 == Unknown
                                    ) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "unpackUint2x16";
                              pcVar8 = "";
                            }
                            else if (((BVar2 ^ Int64) == Unknown && BVar19 == Unknown) &&
                                     (BVar5 ^ UByte) == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "packInt4x16";
                              pcVar8 = "";
                            }
                            else if ((local_38 == Unknown && (BVar3 ^ Int64) == Unknown) &&
                                     BVar12 == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "unpackInt4x16";
                              pcVar8 = "";
                            }
                            else if ((BVar15 == Unknown && BVar6 == Unknown) &&
                                     (BVar5 ^ UByte) == Unknown) {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              pcVar11 = "packUint4x16";
                              pcVar8 = "";
                            }
                            else {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   (pointer)&__return_storage_ptr__->field_2;
                              if ((local_3c != Unknown || BVar17 != Unknown) || BVar12 != Unknown)
                              goto LAB_007651e3;
                              pcVar11 = "unpackUint4x16";
                              pcVar8 = "";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar8);
  }
  else {
    if ((out_type->vecsize == 2) || (in_type->vecsize == 2)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"GL_EXT_buffer_reference_uvec2","");
      require_extension_internal(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
LAB_007651b8:
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,out_type,0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}